

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::enable_multiple_select
          (list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this)

{
  rmutex *in_RDI;
  auto_mutex M;
  auto_mutex *in_stack_ffffffffffffffe0;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI[0x27].m.myMutex.__size[0x10] = '\x01';
  auto_mutex::~auto_mutex((auto_mutex *)0x451f05);
  return;
}

Assistant:

void list_box<S>::
    enable_multiple_select (
    ) 
    {
        auto_mutex M(m);
        ms_enabled = true;
    }